

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase *
AnalyzeShortFunctionDefinition
          (ExpressionContext *ctx,SynShortFunctionDefinition *syntax,TypeBase *type,
          ArrayView<ArgumentData> currArguments,IntrusiveList<MatchData> aliases)

{
  uint uVar1;
  uint uVar2;
  TypeFunction *pTVar3;
  IntrusiveList<TypeHandle> *this;
  TypeHandle *pTVar4;
  ArgumentData *pAVar5;
  TypeBase *pTVar6;
  TypeFunction *argumentType;
  uint local_54;
  TypeBase *pTStack_50;
  uint i;
  TypeBase *target;
  IntrusiveList<TypeHandle> *fuctionArgs;
  TypeFunction *functionType;
  TypeBase *type_local;
  SynShortFunctionDefinition *syntax_local;
  ExpressionContext *ctx_local;
  ArrayView<ArgumentData> currArguments_local;
  
  ctx_local = (ExpressionContext *)currArguments.data;
  currArguments_local.data._0_4_ = currArguments.count;
  pTVar3 = getType<TypeFunction>(type);
  if (pTVar3 == (TypeFunction *)0x0) {
    currArguments_local.count = 0;
    currArguments_local._12_4_ = 0;
  }
  else {
    this = &pTVar3->arguments;
    uVar1 = ArrayView<ArgumentData>::size((ArrayView<ArgumentData> *)&ctx_local);
    uVar2 = IntrusiveList<TypeHandle>::size(this);
    if (uVar2 < uVar1 + 1) {
      currArguments_local.count = 0;
      currArguments_local._12_4_ = 0;
    }
    else {
      if (((pTVar3->super_TypeBase).isGeneric & 1U) == 0) {
        uVar1 = ArrayView<ArgumentData>::size((ArrayView<ArgumentData> *)&ctx_local);
        pTVar4 = IntrusiveList<TypeHandle>::operator[](this,uVar1);
        pTStack_50 = pTVar4->type;
      }
      else {
        for (local_54 = 0;
            uVar1 = ArrayView<ArgumentData>::size((ArrayView<ArgumentData> *)&ctx_local),
            local_54 < uVar1; local_54 = local_54 + 1) {
          pTVar4 = IntrusiveList<TypeHandle>::operator[](this,local_54);
          pTVar6 = pTVar4->type;
          pAVar5 = ArrayView<ArgumentData>::operator[]
                             ((ArrayView<ArgumentData> *)&ctx_local,local_54);
          pTVar6 = MatchGenericType(ctx,&syntax->super_SynBase,pTVar6,pAVar5->type,&aliases,false);
          if (pTVar6 == (TypeBase *)0x0) {
            return (ExprBase *)0x0;
          }
        }
        uVar1 = ArrayView<ArgumentData>::size((ArrayView<ArgumentData> *)&ctx_local);
        pTVar4 = IntrusiveList<TypeHandle>::operator[](this,uVar1);
        pTStack_50 = ResolveGenericTypeAliases(ctx,&syntax->super_SynBase,pTVar4->type,aliases);
      }
      pTVar3 = getType<TypeFunction>(pTStack_50);
      if (pTVar3 == (TypeFunction *)0x0) {
        currArguments_local.count = 0;
        currArguments_local._12_4_ = 0;
      }
      else {
        currArguments_local._8_8_ =
             AnalyzeShortFunctionDefinition(ctx,syntax,(FunctionData *)0x0,pTVar3);
      }
    }
  }
  return (ExprBase *)currArguments_local._8_8_;
}

Assistant:

ExprBase* AnalyzeShortFunctionDefinition(ExpressionContext &ctx, SynShortFunctionDefinition *syntax, TypeBase *type, ArrayView<ArgumentData> currArguments, IntrusiveList<MatchData> aliases)
{
	TypeFunction *functionType = getType<TypeFunction>(type);

	// Only applies to function calls
	if(!functionType)
		return NULL;

	IntrusiveList<TypeHandle> &fuctionArgs = functionType->arguments;

	// Function doesn't accept any more arguments
	if(currArguments.size() + 1 > fuctionArgs.size())
		return NULL;

	// Get current argument type
	TypeBase *target = NULL;

	if(functionType->isGeneric)
	{
		// Collect aliases up to the current argument
		for(unsigned i = 0; i < currArguments.size(); i++)
		{
			// Exit if the arguments before the short inline function fail to match
			if(!MatchGenericType(ctx, syntax, fuctionArgs[i]->type, currArguments[i].type, aliases, false))
				return NULL;
		}

		target = ResolveGenericTypeAliases(ctx, syntax, fuctionArgs[currArguments.size()]->type, aliases);
	}
	else
	{
		target = fuctionArgs[currArguments.size()]->type;
	}

	TypeFunction *argumentType = getType<TypeFunction>(target);

	if(!argumentType)
		return NULL;

	return AnalyzeShortFunctionDefinition(ctx, syntax, NULL, argumentType);
}